

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseHexaLiteral(char *in,char *end,Value **data)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  Value *this;
  long lVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  uint64 value;
  
  *data = (Value *)0x0;
  if (in != end && in != (char *)0x0) {
    do {
      bVar3 = *in;
      if ((0x2c < (ulong)bVar3) || ((0x100100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
      goto LAB_0066f843;
      in = (char *)((byte *)in + 1);
    } while (in != end);
    bVar3 = *end;
    in = end;
LAB_0066f843:
    if (bVar3 == 0x30) {
      if ((((byte *)in)[1] | 0x20) == 0x78) {
        pbVar8 = (byte *)in + 2;
        if (pbVar8 == (byte *)end) {
          value = 0;
          end = (char *)pbVar8;
        }
        else {
          iVar4 = ((int)end - (int)in) + -2;
          lVar5 = 0;
          do {
            bVar3 = pbVar8[lVar5];
            if ((((ulong)bVar3 < 0x2d) && ((0x130100000200U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
               ((bVar3 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar3 - 0x5b) & 0x3f) & 1) != 0))
               )) {
              end = (char *)(pbVar8 + lVar5);
              iVar4 = (int)lVar5;
              break;
            }
            lVar2 = lVar5 + 1;
            lVar5 = lVar5 + 1;
          } while (pbVar8 + lVar2 != (byte *)end);
          value = 0;
          if (0 < iVar4) {
            iVar4 = iVar4 + 1;
            do {
              iVar6 = (int)(char)*pbVar8;
              if ((byte)(*pbVar8 - 0x30) < 10) {
                uVar7 = iVar6 - 0x30;
              }
              else {
                uVar1 = iVar6 - 0x61U;
                if (iVar6 - 0x41U < iVar6 - 0x61U) {
                  uVar1 = iVar6 - 0x41U;
                }
                uVar7 = uVar1 + 10;
                if (0xf < uVar1) {
                  uVar7 = 9999999;
                }
              }
              uVar7 = (int)value << 4 | uVar7;
              value = (uint64)uVar7;
              pbVar8 = pbVar8 + 1;
              iVar4 = iVar4 + -1;
            } while (1 < iVar4);
            value = (uint64)(int)uVar7;
          }
        }
        this = ValueAllocator::allocPrimData(ddl_unsigned_int64,1);
        *data = this;
        in = end;
        if (this != (Value *)0x0) {
          Value::setUnsignedInt64(this,value);
        }
      }
      else {
        in = (char *)((byte *)in + 1);
      }
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseHexaLiteral( char *in, char *end, Value **data ) {
    *data = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in != '0' ) {
        return in;
    }

    ++in;
    if( *in != 'x' && *in != 'X' ) {
        return in;
    }

    ++in;
    bool ok( true );
    char *start( in );
    int pos( 0 );
    while( !isSeparator( *in ) && in != end ) {
        if( ( *in < '0' && *in > '9' ) || ( *in < 'a' && *in > 'f' ) || ( *in < 'A' && *in > 'F' ) ) {
            ok = false;
            break;
        }
        ++pos;
        ++in;
    }

    if( !ok ) {
        return in;
    }

    int value( 0 );
    while( pos > 0 ) {
        int v = hex2Decimal( *start );
        --pos;
        value = ( value << 4 ) | v;
        ++start;
    }

    *data = ValueAllocator::allocPrimData( Value::ddl_unsigned_int64 );
    if( ddl_nullptr != *data ) {
        ( *data )->setUnsignedInt64( value );
    }

    return in;
}